

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfHeader.cpp
# Opt level: O0

void __thiscall Imf_3_4::Header::sanityCheck(Header *this,bool isTiled,bool isMultipartFile)

{
  int iVar1;
  int iVar2;
  bool bVar3;
  ArgExc *pAVar4;
  ostream *poVar5;
  int *piVar6;
  float *pfVar7;
  string *psVar8;
  LineOrder *pLVar9;
  Compression *pCVar10;
  Channel *pCVar11;
  char *pcVar12;
  byte in_DL;
  byte in_SIL;
  stringstream _iex_throw_s_15;
  stringstream _iex_throw_s_14;
  stringstream _iex_throw_s_13;
  stringstream _iex_throw_s_12;
  stringstream _iex_throw_s_11;
  stringstream _iex_throw_s_10;
  stringstream _iex_throw_s_9;
  ConstIterator i_1;
  stringstream _iex_throw_s_8;
  stringstream _iex_throw_s_7;
  stringstream _iex_throw_s_6;
  ConstIterator i;
  stringstream _iex_throw_s_5;
  ChannelList *channels;
  stringstream _iex_throw_s_4;
  stringstream _iex_throw_s_3;
  int maxTileHeight;
  int maxTileWidth;
  TileDescription *tileDesc;
  LineOrder lineOrder;
  bool isDeep;
  string *part_type;
  float screenWindowWidth;
  float MAX_PIXEL_ASPECT_RATIO;
  float MIN_PIXEL_ASPECT_RATIO;
  float pixelAspectRatio;
  stringstream _iex_throw_s_2;
  stringstream _iex_throw_s_1;
  int h;
  stringstream _iex_throw_s;
  int maxImageHeight;
  int maxImageWidth;
  int w;
  Box2i *dataWindow;
  Box2i *displayWindow;
  ChannelList *in_stack_ffffffffffffe348;
  string *in_stack_ffffffffffffe350;
  allocator<char> *in_stack_ffffffffffffe380;
  char *in_stack_ffffffffffffe388;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffe390;
  Header *in_stack_ffffffffffffe410;
  stringstream local_1958 [16];
  ostream local_1948 [376];
  stringstream local_17d0 [16];
  ostream local_17c0 [376];
  stringstream local_1648 [16];
  ostream local_1638 [376];
  stringstream local_14c0 [16];
  ostream local_14b0 [376];
  stringstream local_1338 [16];
  ostream local_1328 [376];
  stringstream local_11b0 [16];
  ostream local_11a0 [376];
  stringstream local_1028 [16];
  ostream local_1018 [376];
  const_iterator local_ea0;
  const_iterator local_e98;
  stringstream local_e90 [16];
  ostream local_e80 [376];
  stringstream local_d08 [16];
  ostream local_cf8 [376];
  stringstream local_b80 [16];
  ostream local_b70 [376];
  const_iterator local_9f8;
  const_iterator local_9f0;
  stringstream local_9e8 [16];
  ostream local_9d8 [376];
  const_iterator local_860;
  const_iterator local_858;
  ChannelList *local_850;
  stringstream local_848 [16];
  ostream local_838 [376];
  stringstream local_6c0 [16];
  ostream local_6b0 [376];
  int local_538;
  int local_534;
  TileDescription *local_530;
  LineOrder local_528;
  byte local_521;
  undefined4 local_520;
  byte local_51a;
  allocator<char> local_519;
  string local_518 [32];
  string *local_4f8;
  float local_4f0;
  undefined4 local_4ec;
  undefined4 local_4e8;
  float local_4e4;
  stringstream local_4e0 [16];
  ostream local_4d0 [376];
  stringstream local_358 [16];
  ostream local_348 [380];
  int local_1cc;
  stringstream local_1c8 [16];
  ostream local_1b8 [380];
  int local_3c;
  int local_38;
  int local_34;
  Box2i *local_30;
  Box2i *local_18;
  byte local_a;
  byte local_9;
  
  local_9 = in_SIL & 1;
  local_a = in_DL & 1;
  local_18 = Header::displayWindow((Header *)0x1d8a5c);
  if (((((local_18->max).x < (local_18->min).x) || ((local_18->max).y < (local_18->min).y)) ||
      ((local_18->min).x < -0x3ffffffe)) ||
     ((((local_18->min).y < -0x3ffffffe || (0x3ffffffe < (local_18->max).x)) ||
      (0x3ffffffe < (local_18->max).y)))) {
    pAVar4 = (ArgExc *)__cxa_allocate_exception(0x48);
    Iex_3_4::ArgExc::ArgExc(pAVar4,"Invalid display window in image header.");
    __cxa_throw(pAVar4,&Iex_3_4::ArgExc::typeinfo,Iex_3_4::ArgExc::~ArgExc);
  }
  local_30 = Header::dataWindow((Header *)0x1d8b4a);
  if ((((local_30->max).x < (local_30->min).x) || ((local_30->max).y < (local_30->min).y)) ||
     (((local_30->min).x < -0x3ffffffe ||
      ((((local_30->min).y < -0x3ffffffe || (0x3ffffffe < (local_30->max).x)) ||
       (0x3ffffffe < (local_30->max).y)))))) {
    pAVar4 = (ArgExc *)__cxa_allocate_exception(0x48);
    Iex_3_4::ArgExc::ArgExc(pAVar4,"Invalid data window in image header.");
    __cxa_throw(pAVar4,&Iex_3_4::ArgExc::typeinfo,Iex_3_4::ArgExc::~ArgExc);
  }
  local_34 = ((local_30->max).x - (local_30->min).x) + 1;
  local_38 = 0;
  local_3c = 0;
  exr_get_default_maximum_image_size(&local_38,&local_3c);
  if ((0 < local_38) && (local_38 < local_34)) {
    iex_debugTrap();
    std::__cxx11::stringstream::stringstream(local_1c8);
    poVar5 = std::operator<<(local_1b8,"The width of the data window exceeds the maximum width of ")
    ;
    poVar5 = (ostream *)std::ostream::operator<<(poVar5,local_38);
    std::operator<<(poVar5,"pixels.");
    pAVar4 = (ArgExc *)__cxa_allocate_exception(0x48);
    Iex_3_4::ArgExc::ArgExc(pAVar4,local_1c8);
    __cxa_throw(pAVar4,&Iex_3_4::ArgExc::typeinfo,Iex_3_4::ArgExc::~ArgExc);
  }
  local_1cc = ((local_30->max).y - (local_30->min).y) + 1;
  if ((0 < local_3c) && (local_3c < local_1cc)) {
    iex_debugTrap();
    std::__cxx11::stringstream::stringstream(local_358);
    poVar5 = std::operator<<(local_348,
                             "The height of the data window exceeds the maximum height of ");
    poVar5 = (ostream *)std::ostream::operator<<(poVar5,local_3c);
    std::operator<<(poVar5,"pixels.");
    pAVar4 = (ArgExc *)__cxa_allocate_exception(0x48);
    Iex_3_4::ArgExc::ArgExc(pAVar4,local_358);
    __cxa_throw(pAVar4,&Iex_3_4::ArgExc::typeinfo,Iex_3_4::ArgExc::~ArgExc);
  }
  if ((((0 < local_3c) && (0 < local_38)) && (bVar3 = hasChunkCount((Header *)0x1d8eee), bVar3)) &&
     (piVar6 = chunkCount((Header *)0x1d8f04),
     (ulong)((long)local_38 * (long)local_3c) < (ulong)(long)*piVar6)) {
    iex_debugTrap();
    std::__cxx11::stringstream::stringstream(local_4e0);
    poVar5 = std::operator<<(local_4d0,"chunkCount exceeds maximum area of ");
    poVar5 = (ostream *)std::ostream::operator<<(poVar5,(long)local_38 * (long)local_3c);
    std::operator<<(poVar5," pixels.");
    pAVar4 = (ArgExc *)__cxa_allocate_exception(0x48);
    Iex_3_4::ArgExc::ArgExc(pAVar4,local_4e0);
    __cxa_throw(pAVar4,&Iex_3_4::ArgExc::typeinfo,Iex_3_4::ArgExc::~ArgExc);
  }
  pfVar7 = Header::pixelAspectRatio((Header *)0x1d9034);
  local_4e4 = *pfVar7;
  local_4e8 = 0x358637bd;
  local_4ec = 0x49742400;
  bVar3 = std::isnormal(local_4e4);
  if (((!bVar3) || (local_4e4 < 1e-06)) || (1e+06 < local_4e4)) {
    pAVar4 = (ArgExc *)__cxa_allocate_exception(0x48);
    Iex_3_4::ArgExc::ArgExc(pAVar4,"Invalid pixel aspect ratio in image header.");
    __cxa_throw(pAVar4,&Iex_3_4::ArgExc::typeinfo,Iex_3_4::ArgExc::~ArgExc);
  }
  pfVar7 = Header::screenWindowWidth((Header *)0x1d9113);
  local_4f0 = *pfVar7;
  if (local_4f0 < 0.0) {
    pAVar4 = (ArgExc *)__cxa_allocate_exception(0x48);
    Iex_3_4::ArgExc::ArgExc(pAVar4,"Invalid screen window width in image header.");
    __cxa_throw(pAVar4,&Iex_3_4::ArgExc::typeinfo,Iex_3_4::ArgExc::~ArgExc);
  }
  if ((local_a & 1) != 0) {
    bVar3 = hasName((Header *)0x1d91af);
    if (!bVar3) {
      pAVar4 = (ArgExc *)__cxa_allocate_exception(0x48);
      Iex_3_4::ArgExc::ArgExc(pAVar4,"Headers in a multipart file should have name attribute.");
      __cxa_throw(pAVar4,&Iex_3_4::ArgExc::typeinfo,Iex_3_4::ArgExc::~ArgExc);
    }
    bVar3 = hasType((Header *)0x1d9227);
    if (!bVar3) {
      pAVar4 = (ArgExc *)__cxa_allocate_exception(0x48);
      Iex_3_4::ArgExc::ArgExc(pAVar4,"Headers in a multipart file should have type attribute.");
      __cxa_throw(pAVar4,&Iex_3_4::ArgExc::typeinfo,Iex_3_4::ArgExc::~ArgExc);
    }
  }
  bVar3 = hasType((Header *)0x1d92a1);
  local_51a = 0;
  if (bVar3) {
    psVar8 = type_abi_cxx11_((Header *)0x1d92bc);
    std::__cxx11::string::string(local_518,(string *)psVar8);
  }
  else {
    std::allocator<char>::allocator();
    local_51a = 1;
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_ffffffffffffe390,in_stack_ffffffffffffe388,in_stack_ffffffffffffe380);
  }
  if ((local_51a & 1) != 0) {
    std::allocator<char>::~allocator(&local_519);
  }
  local_4f8 = local_518;
  bVar3 = std::operator!=(in_stack_ffffffffffffe350,(char *)in_stack_ffffffffffffe348);
  if ((!bVar3) || (bVar3 = isSupportedType(in_stack_ffffffffffffe350), bVar3)) {
    local_521 = isDeepData(in_stack_ffffffffffffe350);
    pLVar9 = Header::lineOrder((Header *)0x1d940f);
    local_528 = *pLVar9;
    if ((local_9 & 1) == 0) {
      if ((local_528 != INCREASING_Y) && (local_528 != DECREASING_Y)) {
        pAVar4 = (ArgExc *)__cxa_allocate_exception(0x48);
        Iex_3_4::ArgExc::ArgExc(pAVar4,"Invalid line order in image header.");
        __cxa_throw(pAVar4,&Iex_3_4::ArgExc::typeinfo,Iex_3_4::ArgExc::~ArgExc);
      }
    }
    else {
      bVar3 = hasTileDescription((Header *)0x1d9445);
      if (!bVar3) {
        pAVar4 = (ArgExc *)__cxa_allocate_exception(0x48);
        Iex_3_4::ArgExc::ArgExc(pAVar4,"Tiled image has no tile description attribute.");
        __cxa_throw(pAVar4,&Iex_3_4::ArgExc::typeinfo,Iex_3_4::ArgExc::~ArgExc);
      }
      local_530 = tileDescription((Header *)0x1d94d4);
      if ((((local_530->xSize == 0) || (local_530->ySize == 0)) || (0x7fffffff < local_530->xSize))
         || (0x7fffffff < local_530->ySize)) {
        pAVar4 = (ArgExc *)__cxa_allocate_exception(0x48);
        Iex_3_4::ArgExc::ArgExc(pAVar4,"Invalid tile size in image header.");
        __cxa_throw(pAVar4,&Iex_3_4::ArgExc::typeinfo,Iex_3_4::ArgExc::~ArgExc);
      }
      local_534 = 0;
      local_538 = 0;
      exr_get_default_maximum_tile_size(&local_534,&local_538);
      if ((0 < local_534) && (local_534 < (int)local_530->xSize)) {
        iex_debugTrap();
        std::__cxx11::stringstream::stringstream(local_6c0);
        poVar5 = std::operator<<(local_6b0,"The width of the tiles exceeds the maximum width of ");
        poVar5 = (ostream *)std::ostream::operator<<(poVar5,local_534);
        std::operator<<(poVar5,"pixels.");
        pAVar4 = (ArgExc *)__cxa_allocate_exception(0x48);
        Iex_3_4::ArgExc::ArgExc(pAVar4,local_6c0);
        __cxa_throw(pAVar4,&Iex_3_4::ArgExc::typeinfo,Iex_3_4::ArgExc::~ArgExc);
      }
      if ((0 < local_538) && (local_538 < (int)local_530->ySize)) {
        iex_debugTrap();
        std::__cxx11::stringstream::stringstream(local_848);
        poVar5 = std::operator<<(local_838,"The width of the tiles exceeds the maximum width of ");
        poVar5 = (ostream *)std::ostream::operator<<(poVar5,local_538);
        std::operator<<(poVar5,"pixels.");
        pAVar4 = (ArgExc *)__cxa_allocate_exception(0x48);
        Iex_3_4::ArgExc::ArgExc(pAVar4,local_848);
        __cxa_throw(pAVar4,&Iex_3_4::ArgExc::typeinfo,Iex_3_4::ArgExc::~ArgExc);
      }
      if (((local_530->mode != ONE_LEVEL) && (local_530->mode != MIPMAP_LEVELS)) &&
         (local_530->mode != RIPMAP_LEVELS)) {
        pAVar4 = (ArgExc *)__cxa_allocate_exception(0x48);
        Iex_3_4::ArgExc::ArgExc(pAVar4,"Invalid level mode in image header.");
        __cxa_throw(pAVar4,&Iex_3_4::ArgExc::typeinfo,Iex_3_4::ArgExc::~ArgExc);
      }
      if ((local_530->roundingMode != ROUND_UP) && (local_530->roundingMode != ROUND_DOWN)) {
        pAVar4 = (ArgExc *)__cxa_allocate_exception(0x48);
        Iex_3_4::ArgExc::ArgExc(pAVar4,"Invalid level rounding mode in image header.");
        __cxa_throw(pAVar4,&Iex_3_4::ArgExc::typeinfo,Iex_3_4::ArgExc::~ArgExc);
      }
      if (((local_528 != INCREASING_Y) && (local_528 != DECREASING_Y)) && (local_528 != RANDOM_Y)) {
        pAVar4 = (ArgExc *)__cxa_allocate_exception(0x48);
        Iex_3_4::ArgExc::ArgExc(pAVar4,"Invalid line order in image header.");
        __cxa_throw(pAVar4,&Iex_3_4::ArgExc::typeinfo,Iex_3_4::ArgExc::~ArgExc);
      }
      getTiledChunkOffsetTableSize(in_stack_ffffffffffffe410);
    }
    pCVar10 = compression((Header *)0x1d9a55);
    bVar3 = isValidCompression(*pCVar10);
    if (!bVar3) {
      pAVar4 = (ArgExc *)__cxa_allocate_exception(0x48);
      Iex_3_4::ArgExc::ArgExc(pAVar4,"Unknown compression type in image header.");
      __cxa_throw(pAVar4,&Iex_3_4::ArgExc::typeinfo,Iex_3_4::ArgExc::~ArgExc);
    }
    if ((local_521 & 1) != 0) {
      pCVar10 = compression((Header *)0x1d9b0b);
      bVar3 = isValidDeepCompression(*pCVar10);
      if (!bVar3) {
        pAVar4 = (ArgExc *)__cxa_allocate_exception(0x48);
        Iex_3_4::ArgExc::ArgExc(pAVar4,"Compression type in header not valid for deep data");
        __cxa_throw(pAVar4,&Iex_3_4::ArgExc::typeinfo,Iex_3_4::ArgExc::~ArgExc);
      }
    }
    local_850 = Header::channels((Header *)0x1d9bb5);
    local_858._M_node = (_Base_ptr)ChannelList::begin(in_stack_ffffffffffffe348);
    local_860._M_node = (_Base_ptr)ChannelList::end(in_stack_ffffffffffffe348);
    bVar3 = Imf_3_4::operator==((ConstIterator *)in_stack_ffffffffffffe350,
                                (ConstIterator *)in_stack_ffffffffffffe348);
    if (bVar3) {
      iex_debugTrap();
      std::__cxx11::stringstream::stringstream(local_9e8);
      std::operator<<(local_9d8,"Missing or empty channel list in header");
      pAVar4 = (ArgExc *)__cxa_allocate_exception(0x48);
      Iex_3_4::ArgExc::ArgExc(pAVar4,local_9e8);
      __cxa_throw(pAVar4,&Iex_3_4::ArgExc::typeinfo,Iex_3_4::ArgExc::~ArgExc);
    }
    if (((local_9 & 1) == 0) && ((local_521 & 1) == 0)) {
      local_e98._M_node = (_Base_ptr)ChannelList::begin(in_stack_ffffffffffffe348);
      while( true ) {
        local_ea0._M_node = (_Base_ptr)ChannelList::end(in_stack_ffffffffffffe348);
        bVar3 = Imf_3_4::operator!=((ConstIterator *)in_stack_ffffffffffffe350,
                                    (ConstIterator *)in_stack_ffffffffffffe348);
        if (!bVar3) break;
        pCVar11 = ChannelList::ConstIterator::channel((ConstIterator *)0x1da241);
        if (((pCVar11->type != UINT) &&
            (pCVar11 = ChannelList::ConstIterator::channel((ConstIterator *)0x1da269),
            pCVar11->type != HALF)) &&
           (pCVar11 = ChannelList::ConstIterator::channel((ConstIterator *)0x1da291),
           pCVar11->type != FLOAT)) {
          iex_debugTrap();
          std::__cxx11::stringstream::stringstream(local_1028);
          poVar5 = std::operator<<(local_1018,"Pixel type of \"");
          pcVar12 = ChannelList::ConstIterator::name((ConstIterator *)0x1da2ef);
          poVar5 = std::operator<<(poVar5,pcVar12);
          std::operator<<(poVar5,"\" image channel is invalid.");
          pAVar4 = (ArgExc *)__cxa_allocate_exception(0x48);
          Iex_3_4::ArgExc::ArgExc(pAVar4,local_1028);
          __cxa_throw(pAVar4,&Iex_3_4::ArgExc::typeinfo,Iex_3_4::ArgExc::~ArgExc);
        }
        pCVar11 = ChannelList::ConstIterator::channel((ConstIterator *)0x1da3cb);
        if (pCVar11->xSampling < 1) {
          iex_debugTrap();
          std::__cxx11::stringstream::stringstream(local_11b0);
          poVar5 = std::operator<<(local_11a0,"The x subsampling factor for the \"");
          pcVar12 = ChannelList::ConstIterator::name((ConstIterator *)0x1da42a);
          poVar5 = std::operator<<(poVar5,pcVar12);
          std::operator<<(poVar5,"\" channel is invalid.");
          pAVar4 = (ArgExc *)__cxa_allocate_exception(0x48);
          Iex_3_4::ArgExc::ArgExc(pAVar4,local_11b0);
          __cxa_throw(pAVar4,&Iex_3_4::ArgExc::typeinfo,Iex_3_4::ArgExc::~ArgExc);
        }
        pCVar11 = ChannelList::ConstIterator::channel((ConstIterator *)0x1da506);
        if (pCVar11->ySampling < 1) {
          iex_debugTrap();
          std::__cxx11::stringstream::stringstream(local_1338);
          poVar5 = std::operator<<(local_1328,"The y subsampling factor for the \"");
          pcVar12 = ChannelList::ConstIterator::name((ConstIterator *)0x1da565);
          poVar5 = std::operator<<(poVar5,pcVar12);
          std::operator<<(poVar5,"\" channel is invalid.");
          pAVar4 = (ArgExc *)__cxa_allocate_exception(0x48);
          Iex_3_4::ArgExc::ArgExc(pAVar4,local_1338);
          __cxa_throw(pAVar4,&Iex_3_4::ArgExc::typeinfo,Iex_3_4::ArgExc::~ArgExc);
        }
        iVar1 = (local_30->min).x;
        pCVar11 = ChannelList::ConstIterator::channel((ConstIterator *)0x1da652);
        if (iVar1 % pCVar11->xSampling != 0) {
          iex_debugTrap();
          std::__cxx11::stringstream::stringstream(local_14c0);
          poVar5 = std::operator<<(local_14b0,
                                   "The minimum x coordinate of the image\'s data window is not a multiple of the x subsampling factor of the \""
                                  );
          pcVar12 = ChannelList::ConstIterator::name((ConstIterator *)0x1da6bb);
          poVar5 = std::operator<<(poVar5,pcVar12);
          std::operator<<(poVar5,"\" channel.");
          pAVar4 = (ArgExc *)__cxa_allocate_exception(0x48);
          Iex_3_4::ArgExc::ArgExc(pAVar4,local_14c0);
          __cxa_throw(pAVar4,&Iex_3_4::ArgExc::typeinfo,Iex_3_4::ArgExc::~ArgExc);
        }
        iVar1 = (local_30->min).y;
        pCVar11 = ChannelList::ConstIterator::channel((ConstIterator *)0x1da7a9);
        if (iVar1 % pCVar11->ySampling != 0) {
          iex_debugTrap();
          std::__cxx11::stringstream::stringstream(local_1648);
          poVar5 = std::operator<<(local_1638,
                                   "The minimum y coordinate of the image\'s data window is not a multiple of the y subsampling factor of the \""
                                  );
          pcVar12 = ChannelList::ConstIterator::name((ConstIterator *)0x1da80f);
          poVar5 = std::operator<<(poVar5,pcVar12);
          std::operator<<(poVar5,"\" channel.");
          pAVar4 = (ArgExc *)__cxa_allocate_exception(0x48);
          Iex_3_4::ArgExc::ArgExc(pAVar4,local_1648);
          __cxa_throw(pAVar4,&Iex_3_4::ArgExc::typeinfo,Iex_3_4::ArgExc::~ArgExc);
        }
        iVar1 = (local_30->min).x;
        iVar2 = (local_30->max).x;
        pCVar11 = ChannelList::ConstIterator::channel((ConstIterator *)0x1da8e8);
        if (((iVar2 - iVar1) + 1) % pCVar11->xSampling != 0) {
          iex_debugTrap();
          std::__cxx11::stringstream::stringstream(local_17d0);
          poVar5 = std::operator<<(local_17c0,
                                   "Number of pixels per row in the image\'s data window is not a multiple of the x subsampling factor of the \""
                                  );
          pcVar12 = ChannelList::ConstIterator::name((ConstIterator *)0x1da945);
          poVar5 = std::operator<<(poVar5,pcVar12);
          std::operator<<(poVar5,"\" channel.");
          pAVar4 = (ArgExc *)__cxa_allocate_exception(0x48);
          Iex_3_4::ArgExc::ArgExc(pAVar4,local_17d0);
          __cxa_throw(pAVar4,&Iex_3_4::ArgExc::typeinfo,Iex_3_4::ArgExc::~ArgExc);
        }
        iVar1 = (local_30->min).y;
        iVar2 = (local_30->max).y;
        pCVar11 = ChannelList::ConstIterator::channel((ConstIterator *)0x1daa1f);
        if (((iVar2 - iVar1) + 1) % pCVar11->ySampling != 0) {
          iex_debugTrap();
          std::__cxx11::stringstream::stringstream(local_1958);
          poVar5 = std::operator<<(local_1948,
                                   "Number of pixels per column in the image\'s data window is not a multiple of the y subsampling factor of the \""
                                  );
          pcVar12 = ChannelList::ConstIterator::name((ConstIterator *)0x1daa7c);
          poVar5 = std::operator<<(poVar5,pcVar12);
          std::operator<<(poVar5,"\" channel.");
          pAVar4 = (ArgExc *)__cxa_allocate_exception(0x48);
          Iex_3_4::ArgExc::ArgExc(pAVar4,local_1958);
          __cxa_throw(pAVar4,&Iex_3_4::ArgExc::typeinfo,Iex_3_4::ArgExc::~ArgExc);
        }
        ChannelList::ConstIterator::operator++((ConstIterator *)in_stack_ffffffffffffe350);
      }
    }
    else {
      local_9f0._M_node = (_Base_ptr)ChannelList::begin(in_stack_ffffffffffffe348);
      while( true ) {
        local_9f8._M_node = (_Base_ptr)ChannelList::end(in_stack_ffffffffffffe348);
        bVar3 = Imf_3_4::operator!=((ConstIterator *)in_stack_ffffffffffffe350,
                                    (ConstIterator *)in_stack_ffffffffffffe348);
        if (!bVar3) break;
        pCVar11 = ChannelList::ConstIterator::channel((ConstIterator *)0x1d9daa);
        if (((pCVar11->type != UINT) &&
            (pCVar11 = ChannelList::ConstIterator::channel((ConstIterator *)0x1d9dd2),
            pCVar11->type != HALF)) &&
           (pCVar11 = ChannelList::ConstIterator::channel((ConstIterator *)0x1d9dfa),
           pCVar11->type != FLOAT)) {
          iex_debugTrap();
          std::__cxx11::stringstream::stringstream(local_b80);
          poVar5 = std::operator<<(local_b70,"Pixel type of \"");
          pcVar12 = ChannelList::ConstIterator::name((ConstIterator *)0x1d9e58);
          poVar5 = std::operator<<(poVar5,pcVar12);
          std::operator<<(poVar5,"\" image channel is invalid.");
          pAVar4 = (ArgExc *)__cxa_allocate_exception(0x48);
          Iex_3_4::ArgExc::ArgExc(pAVar4,local_b80);
          __cxa_throw(pAVar4,&Iex_3_4::ArgExc::typeinfo,Iex_3_4::ArgExc::~ArgExc);
        }
        pCVar11 = ChannelList::ConstIterator::channel((ConstIterator *)0x1d9f34);
        if (pCVar11->xSampling != 1) {
          iex_debugTrap();
          std::__cxx11::stringstream::stringstream(local_d08);
          poVar5 = std::operator<<(local_cf8,"The x subsampling factor for the \"");
          pcVar12 = ChannelList::ConstIterator::name((ConstIterator *)0x1d9f93);
          poVar5 = std::operator<<(poVar5,pcVar12);
          std::operator<<(poVar5,"\" channel is not 1.");
          pAVar4 = (ArgExc *)__cxa_allocate_exception(0x48);
          Iex_3_4::ArgExc::ArgExc(pAVar4,local_d08);
          __cxa_throw(pAVar4,&Iex_3_4::ArgExc::typeinfo,Iex_3_4::ArgExc::~ArgExc);
        }
        pCVar11 = ChannelList::ConstIterator::channel((ConstIterator *)0x1da06f);
        if (pCVar11->ySampling != 1) {
          iex_debugTrap();
          std::__cxx11::stringstream::stringstream(local_e90);
          poVar5 = std::operator<<(local_e80,"The y subsampling factor for the \"");
          pcVar12 = ChannelList::ConstIterator::name((ConstIterator *)0x1da0ce);
          poVar5 = std::operator<<(poVar5,pcVar12);
          std::operator<<(poVar5,"\" channel is not 1.");
          pAVar4 = (ArgExc *)__cxa_allocate_exception(0x48);
          Iex_3_4::ArgExc::ArgExc(pAVar4,local_e90);
          __cxa_throw(pAVar4,&Iex_3_4::ArgExc::typeinfo,Iex_3_4::ArgExc::~ArgExc);
        }
        ChannelList::ConstIterator::operator++((ConstIterator *)in_stack_ffffffffffffe350);
      }
    }
    local_520 = 0;
  }
  else {
    local_520 = 1;
  }
  std::__cxx11::string::~string(local_518);
  return;
}

Assistant:

void
Header::sanityCheck (bool isTiled, bool isMultipartFile) const
{
    //
    // The display window and the data window must each
    // contain at least one pixel.  In addition, the
    // coordinates of the window corners must be small
    // enough to keep expressions like max-min+1 or
    // max+min from overflowing.
    //

    const Box2i& displayWindow = this->displayWindow ();

    if (displayWindow.min.x > displayWindow.max.x ||
        displayWindow.min.y > displayWindow.max.y ||
        displayWindow.min.x <= -(INT_MAX / 2) ||
        displayWindow.min.y <= -(INT_MAX / 2) ||
        displayWindow.max.x >= (INT_MAX / 2) ||
        displayWindow.max.y >= (INT_MAX / 2))
    {
        throw IEX_NAMESPACE::ArgExc ("Invalid display window in image header.");
    }

    const Box2i& dataWindow = this->dataWindow ();

    if (dataWindow.min.x > dataWindow.max.x ||
        dataWindow.min.y > dataWindow.max.y ||
        dataWindow.min.x <= -(INT_MAX / 2) ||
        dataWindow.min.y <= -(INT_MAX / 2) ||
        dataWindow.max.x >= (INT_MAX / 2) || dataWindow.max.y >= (INT_MAX / 2))
    {
        throw IEX_NAMESPACE::ArgExc ("Invalid data window in image header.");
    }

    int w = (dataWindow.max.x - dataWindow.min.x + 1);

    int maxImageWidth = 0, maxImageHeight = 0;
    // TODO: this really should be accessed via the context but
    // we don't have that fully wired through just yet, so continue
    // to use the default as the older C++ code has done
    exr_get_default_maximum_image_size (&maxImageWidth, &maxImageHeight);

    if (maxImageWidth > 0 && maxImageWidth < w)
    {
        THROW (
            IEX_NAMESPACE::ArgExc,
            "The width of the data window exceeds the "
            "maximum width of "
                << maxImageWidth << "pixels.");
    }

    int h = (dataWindow.max.y - dataWindow.min.y + 1);
    if (maxImageHeight > 0 && maxImageHeight < h)
    {
        THROW (
            IEX_NAMESPACE::ArgExc,
            "The height of the data window exceeds the "
            "maximum height of "
                << maxImageHeight << "pixels.");
    }

    // chunk table must be smaller than the maximum image area
    // (only reachable for unknown types or damaged files: will have thrown earlier
    //  for regular image types)
    if (maxImageHeight > 0 && maxImageWidth > 0 && hasChunkCount () &&
        static_cast<uint64_t> (chunkCount ()) >
            uint64_t (maxImageWidth) * uint64_t (maxImageHeight))
    {
        THROW (
            IEX_NAMESPACE::ArgExc,
            "chunkCount exceeds maximum area of "
                << uint64_t (maxImageWidth) * uint64_t (maxImageHeight)
                << " pixels.");
    }

    //
    // The pixel aspect ratio must be greater than 0.
    // In applications, numbers like the display or the
    // data window dimensions are likely to be multiplied
    // or divided by the pixel aspect ratio; to avoid
    // arithmetic exceptions, we limit the pixel aspect
    // ratio to a range that is smaller than theoretically
    // possible (real aspect ratios are likely to be close
    // to 1.0 anyway).
    //

    float pixelAspectRatio = this->pixelAspectRatio ();

    const float MIN_PIXEL_ASPECT_RATIO = 1e-6f;
    const float MAX_PIXEL_ASPECT_RATIO = 1e+6f;

    if (!std::isnormal (pixelAspectRatio) ||
        pixelAspectRatio < MIN_PIXEL_ASPECT_RATIO ||
        pixelAspectRatio > MAX_PIXEL_ASPECT_RATIO)
    {
        throw IEX_NAMESPACE::ArgExc (
            "Invalid pixel aspect ratio in image header.");
    }

    //
    // The screen window width must not be less than 0.
    // The size of the screen window can vary over a wide
    // range (fish-eye lens to astronomical telescope),
    // so we can't limit the screen window width to a
    // small range.
    //

    float screenWindowWidth = this->screenWindowWidth ();

    if (screenWindowWidth < 0)
        throw IEX_NAMESPACE::ArgExc (
            "Invalid screen window width in image header.");

    //
    // If the file has multiple parts, verify that each header has attribute
    // name and type.
    // (TODO) We may want to check more stuff here.
    //

    if (isMultipartFile)
    {
        if (!hasName ())
        {
            throw IEX_NAMESPACE::ArgExc ("Headers in a multipart file should"
                                         " have name attribute.");
        }

        if (!hasType ())
        {
            throw IEX_NAMESPACE::ArgExc ("Headers in a multipart file should"
                                         " have type attribute.");
        }
    }

    const std::string& part_type = hasType () ? type () : "";

    if (part_type != "" && !isSupportedType (part_type))
    {
        //
        // skip remaining sanity checks with unsupported types - they may not hold
        //
        return;
    }

    bool isDeep = isDeepData (part_type);

    //
    // If the file is tiled, verify that the tile description has reasonable
    // values and check to see if the lineOrder is one of the predefined 3.
    // If the file is not tiled, then the lineOrder can only be INCREASING_Y
    // or DECREASING_Y.
    //

    LineOrder lineOrder = this->lineOrder ();

    if (isTiled)
    {
        if (!hasTileDescription ())
        {
            throw IEX_NAMESPACE::ArgExc ("Tiled image has no tile "
                                         "description attribute.");
        }

        const TileDescription& tileDesc = tileDescription ();

        if (tileDesc.xSize <= 0 || tileDesc.ySize <= 0 ||
            tileDesc.xSize > INT_MAX || tileDesc.ySize > INT_MAX)
            throw IEX_NAMESPACE::ArgExc ("Invalid tile size in image header.");

        int maxTileWidth = 0, maxTileHeight = 0;
        // TODO: this really should be accessed via the context but
        // we don't have that fully wired through just yet, so continue
        // to use the default as the older C++ code has done
        exr_get_default_maximum_tile_size (&maxTileWidth, &maxTileHeight);

        if (maxTileWidth > 0 && maxTileWidth < int (tileDesc.xSize))
        {
            THROW (
                IEX_NAMESPACE::ArgExc,
                "The width of the tiles exceeds the maximum "
                "width of "
                    << maxTileWidth << "pixels.");
        }

        if (maxTileHeight > 0 && maxTileHeight < int (tileDesc.ySize))
        {
            THROW (
                IEX_NAMESPACE::ArgExc,
                "The width of the tiles exceeds the maximum "
                "width of "
                    << maxTileHeight << "pixels.");
        }

        if (tileDesc.mode != ONE_LEVEL && tileDesc.mode != MIPMAP_LEVELS &&
            tileDesc.mode != RIPMAP_LEVELS)
            throw IEX_NAMESPACE::ArgExc ("Invalid level mode in image header.");

        if (tileDesc.roundingMode != ROUND_UP &&
            tileDesc.roundingMode != ROUND_DOWN)
            throw IEX_NAMESPACE::ArgExc (
                "Invalid level rounding mode in image header.");

        if (lineOrder != INCREASING_Y && lineOrder != DECREASING_Y &&
            lineOrder != RANDOM_Y)
            throw IEX_NAMESPACE::ArgExc ("Invalid line order in image header.");

        // computes size of chunk offset table. Throws an exception if this exceeds
        // the maximum allowable size
        getTiledChunkOffsetTableSize (*this);
    }
    else
    {
        if (lineOrder != INCREASING_Y && lineOrder != DECREASING_Y)
            throw IEX_NAMESPACE::ArgExc ("Invalid line order in image header.");
    }

    //
    // The compression method must be one of the predefined values.
    //

    if (!isValidCompression (this->compression ()))
        throw IEX_NAMESPACE::ArgExc (
            "Unknown compression type in image header.");

    if (isDeep)
    {
        if (!isValidDeepCompression (this->compression ()))
            throw IEX_NAMESPACE::ArgExc (
                "Compression type in header not valid for deep data");
    }

    //
    // Check the channel list:
    //
    // If the file is tiled then for each channel, the type must be one of the
    // predefined values, and the x and y sampling must both be 1.
    //
    // x and y sampling must currently also be 1 for deep scanline images
    //
    // If the file is not tiled then for each channel, the type must be one
    // of the predefined values, the x and y coordinates of the data window's
    // upper left corner must be divisible by the x and y subsampling factors,
    // and the width and height of the data window must be divisible by the
    // x and y subsampling factors.
    //

    const ChannelList& channels = this->channels ();

    if (channels.begin () == channels.end ())
    {
        THROW (
            IEX_NAMESPACE::ArgExc, "Missing or empty channel list in header");
    }

    if (isTiled || isDeep)
    {
        for (ChannelList::ConstIterator i = channels.begin ();
             i != channels.end ();
             ++i)
        {
            if (i.channel ().type != OPENEXR_IMF_INTERNAL_NAMESPACE::UINT &&
                i.channel ().type != OPENEXR_IMF_INTERNAL_NAMESPACE::HALF &&
                i.channel ().type != OPENEXR_IMF_INTERNAL_NAMESPACE::FLOAT)
            {
                THROW (
                    IEX_NAMESPACE::ArgExc,
                    "Pixel type of \"" << i.name ()
                                       << "\" "
                                          "image channel is invalid.");
            }

            if (i.channel ().xSampling != 1)
            {
                THROW (
                    IEX_NAMESPACE::ArgExc,
                    "The x subsampling factor for the "
                    "\"" << i.name ()
                         << "\" channel "
                            "is not 1.");
            }

            if (i.channel ().ySampling != 1)
            {
                THROW (
                    IEX_NAMESPACE::ArgExc,
                    "The y subsampling factor for the "
                    "\"" << i.name ()
                         << "\" channel "
                            "is not 1.");
            }
        }
    }
    else
    {
        for (ChannelList::ConstIterator i = channels.begin ();
             i != channels.end ();
             ++i)
        {
            if (i.channel ().type != OPENEXR_IMF_INTERNAL_NAMESPACE::UINT &&
                i.channel ().type != OPENEXR_IMF_INTERNAL_NAMESPACE::HALF &&
                i.channel ().type != OPENEXR_IMF_INTERNAL_NAMESPACE::FLOAT)
            {
                THROW (
                    IEX_NAMESPACE::ArgExc,
                    "Pixel type of \"" << i.name ()
                                       << "\" "
                                          "image channel is invalid.");
            }

            if (i.channel ().xSampling < 1)
            {
                THROW (
                    IEX_NAMESPACE::ArgExc,
                    "The x subsampling factor for the "
                    "\"" << i.name ()
                         << "\" channel "
                            "is invalid.");
            }

            if (i.channel ().ySampling < 1)
            {
                THROW (
                    IEX_NAMESPACE::ArgExc,
                    "The y subsampling factor for the "
                    "\"" << i.name ()
                         << "\" channel "
                            "is invalid.");
            }

            if (dataWindow.min.x % i.channel ().xSampling)
            {
                THROW (
                    IEX_NAMESPACE::ArgExc,
                    "The minimum x coordinate of the "
                    "image's data window is not a multiple "
                    "of the x subsampling factor of "
                    "the \""
                        << i.name () << "\" channel.");
            }

            if (dataWindow.min.y % i.channel ().ySampling)
            {
                THROW (
                    IEX_NAMESPACE::ArgExc,
                    "The minimum y coordinate of the "
                    "image's data window is not a multiple "
                    "of the y subsampling factor of "
                    "the \""
                        << i.name () << "\" channel.");
            }

            if ((dataWindow.max.x - dataWindow.min.x + 1) %
                i.channel ().xSampling)
            {
                THROW (
                    IEX_NAMESPACE::ArgExc,
                    "Number of pixels per row in the "
                    "image's data window is not a multiple "
                    "of the x subsampling factor of "
                    "the \""
                        << i.name () << "\" channel.");
            }

            if ((dataWindow.max.y - dataWindow.min.y + 1) %
                i.channel ().ySampling)
            {
                THROW (
                    IEX_NAMESPACE::ArgExc,
                    "Number of pixels per column in the "
                    "image's data window is not a multiple "
                    "of the y subsampling factor of "
                    "the \""
                        << i.name () << "\" channel.");
            }
        }
    }
}